

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O2

adios2_error
adios2_set_operation_parameter(adios2_variable *variable,size_t operation_id,char *key,char *value)

{
  allocator local_a1;
  allocator local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40;
  
  std::__cxx11::string::string
            ((string *)&local_40,"for adios2_variable, in call to adios2_set_operation_parameter",
             local_a0);
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string(local_60,key,local_a0);
  std::__cxx11::string::string(local_80,value,&local_a1);
  adios2::core::VariableBase::SetOperationParameter(variable,operation_id,local_60,local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_set_operation_parameter(adios2_variable *variable, const size_t operation_id,
                                            const char *key, const char *value)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_set_operation_parameter");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);
        variableBase->SetOperationParameter(operation_id, key, value);
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_set_operation_parameter"));
    }
}